

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::LocalAccessChainConvertPass::ReplaceAccessChainLoad
          (LocalAccessChainConvertPass *this,Instruction *address_inst,Instruction *original_load)

{
  IRContext *pIVar1;
  DecorationManager *this_00;
  Instruction *pIVar2;
  Operand *__args;
  pointer pOVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  array<signed_char,_4UL> to;
  uint uVar6;
  Instruction *inst;
  bool bVar7;
  OperandList new_operands;
  uint32_t varPteTypeId;
  uint32_t varId;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  new_inst;
  OperandList local_c8;
  uint32_t local_b0;
  uint32_t local_ac;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  local_a8;
  undefined1 local_88 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_60;
  undefined1 local_58 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  bVar7 = address_inst->has_result_id_;
  uVar6 = (bVar7 & 1) + 1;
  if (address_inst->has_type_id_ == false) {
    uVar6 = (uint)bVar7;
  }
  if ((int)((ulong)((long)(address_inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(address_inst->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar6 == 1
     ) {
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    uVar4 = 0;
    if ((bVar7 & 1U) != 0) {
      uVar4 = Instruction::GetSingleWordOperand(address_inst,(uint)address_inst->has_type_id_);
    }
    uVar5 = (address_inst->has_result_id_ & 1) + 1;
    if (address_inst->has_type_id_ == false) {
      uVar5 = (uint)address_inst->has_result_id_;
    }
    uVar5 = Instruction::GetSingleWordOperand(address_inst,uVar5);
    IRContext::ReplaceAllUsesWith(pIVar1,uVar4,uVar5);
    bVar7 = true;
  }
  else {
    local_a8.
    super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.
    super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    to._M_elems = (_Type)BuildAndAppendVarLoad(this,address_inst,&local_ac,&local_b0,&local_a8);
    bVar7 = to._M_elems != (_Type)0x0;
    if (bVar7) {
      Instruction::UpdateDebugInfoFrom
                (((local_a8.
                   super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
                 original_load);
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
        IRContext::BuildDecorationManager(pIVar1);
      }
      this_00 = (pIVar1->decoration_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                _M_head_impl;
      uVar4 = 0;
      if (original_load->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(original_load,(uint)original_load->has_type_id_);
      }
      local_88._0_8_ = (pointer)0x0;
      local_88._8_8_ = (_func_int **)0x0;
      local_88._16_8_ = (pointer)0x0;
      local_88._0_8_ = operator_new(4);
      local_88._8_8_ = local_88._0_8_ + 4;
      *(Decoration *)local_88._0_8_ = DecorationRelaxedPrecision;
      local_88._16_8_ = local_88._8_8_;
      analysis::DecorationManager::CloneDecorations
                (this_00,uVar4,(uint32_t)to._M_elems,
                 (vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)local_88);
      if ((pointer)local_88._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
      }
      Instruction::InsertBefore(original_load,&local_a8);
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar1->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
        IRContext::BuildDebugInfoManager(pIVar1);
      }
      pIVar2 = (original_load->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      inst = (Instruction *)0x0;
      if ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
        inst = pIVar2;
      }
      analysis::DebugInfoManager::AnalyzeDebugInst
                ((pIVar1->debug_info_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
                 _M_head_impl,inst);
      local_c8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __args = (original_load->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((original_load->operands_).
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish == __args) {
LAB_005dfcc8:
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
      }
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      emplace_back<spvtools::opt::Operand&>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_c8,
                 __args);
      pOVar3 = (original_load->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(original_load->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) *
                 -0x5555555555555555) < 2) goto LAB_005dfcc8;
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      emplace_back<spvtools::opt::Operand&>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_c8,
                 pOVar3 + 1);
      local_58._24_8_ = local_58 + 0x10;
      local_58._0_8_ = &PTR__SmallVector_009488e0;
      local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_58._8_8_ = 1;
      local_88._0_4_ = 1;
      local_88._8_8_ = &PTR__SmallVector_009488e0;
      local_88._16_8_ = (pointer)0x0;
      local_88._32_8_ = local_88 + 0x18;
      local_60._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_58._16_4_ = to._M_elems;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)(local_88 + 8),
                 (SmallVector<unsigned_int,_2UL> *)local_58);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &local_c8,(Operand *)local_88);
      local_88._8_8_ = &PTR__SmallVector_009488e0;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_60._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_60,local_60._M_head_impl);
      }
      local_60._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_58._0_8_ = &PTR__SmallVector_009488e0;
      if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_38,local_38._M_head_impl);
      }
      AppendConstantOperands(this,address_inst,&local_c8);
      original_load->opcode_ = OpCompositeExtract;
      Instruction::ReplaceOperands(original_load,&local_c8);
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        analysis::DefUseManager::UpdateDefUse
                  ((pIVar1->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,original_load);
      }
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&local_c8);
    }
    std::
    vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
    ::~vector(&local_a8);
  }
  return bVar7;
}

Assistant:

bool LocalAccessChainConvertPass::ReplaceAccessChainLoad(
    const Instruction* address_inst, Instruction* original_load) {
  // Build and append load of variable in ptrInst
  if (address_inst->NumInOperands() == 1) {
    // An access chain with no indices is essentially a copy.  All that is
    // needed is to propagate the address.
    context()->ReplaceAllUsesWith(
        address_inst->result_id(),
        address_inst->GetSingleWordInOperand(kAccessChainPtrIdInIdx));
    return true;
  }

  std::vector<std::unique_ptr<Instruction>> new_inst;
  uint32_t varId;
  uint32_t varPteTypeId;
  const uint32_t ldResultId =
      BuildAndAppendVarLoad(address_inst, &varId, &varPteTypeId, &new_inst);
  if (ldResultId == 0) {
    return false;
  }

  new_inst[0]->UpdateDebugInfoFrom(original_load);
  context()->get_decoration_mgr()->CloneDecorations(
      original_load->result_id(), ldResultId,
      {spv::Decoration::RelaxedPrecision});
  original_load->InsertBefore(std::move(new_inst));
  context()->get_debug_info_mgr()->AnalyzeDebugInst(
      original_load->PreviousNode());

  // Rewrite |original_load| into an extract.
  Instruction::OperandList new_operands;

  // copy the result id and the type id to the new operand list.
  new_operands.emplace_back(original_load->GetOperand(0));
  new_operands.emplace_back(original_load->GetOperand(1));

  new_operands.emplace_back(
      Operand({spv_operand_type_t::SPV_OPERAND_TYPE_ID, {ldResultId}}));
  AppendConstantOperands(address_inst, &new_operands);
  original_load->SetOpcode(spv::Op::OpCompositeExtract);
  original_load->ReplaceOperands(new_operands);
  context()->UpdateDefUse(original_load);
  return true;
}